

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O1

BasicValue * cvm::Ncurses::GetMaxX(list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_1)

{
  int iVar1;
  BasicValue *in_RDI;
  
  if (_stdscr == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = *(short *)(_stdscr + 6) + 1;
  }
  in_RDI->Type = IntType;
  (in_RDI->StrVal)._M_dataplus._M_p = (pointer)&(in_RDI->StrVal).field_2;
  (in_RDI->StrVal)._M_string_length = 0;
  (in_RDI->StrVal).field_2._M_local_buf[0] = '\0';
  (in_RDI->field_2).IntVal = iVar1;
  (in_RDI->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (in_RDI->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return in_RDI;
}

Assistant:

BasicValue Ncurses::GetMaxX(std::list<BasicValue> &/*Args*/) {
  return getmaxx(stdscr);
}